

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void aom_h_predictor_4x8_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint8_t *puVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 uStack_190;
  undefined1 uStack_18f;
  undefined1 uStack_18e;
  undefined1 uStack_18d;
  undefined4 local_168;
  undefined4 local_148;
  undefined4 local_128;
  undefined4 local_108;
  undefined4 local_e8;
  undefined4 local_c8;
  undefined4 local_a8;
  undefined4 uStack_88;
  __m128i row3;
  __m128i row2;
  __m128i row1;
  __m128i row0;
  __m128i left_col;
  uint8_t *left_local;
  uint8_t *above_local;
  ptrdiff_t stride_local;
  uint8_t *dst_local;
  
  uVar1 = *(undefined8 *)left;
  row1[1]._0_1_ = (undefined1)uVar1;
  row1[1]._1_1_ = (undefined1)((ulong)uVar1 >> 8);
  row1[1]._2_1_ = (undefined1)((ulong)uVar1 >> 0x10);
  row1[1]._3_1_ = (undefined1)((ulong)uVar1 >> 0x18);
  row1[1]._4_1_ = (undefined1)((ulong)uVar1 >> 0x20);
  row1[1]._5_1_ = (undefined1)((ulong)uVar1 >> 0x28);
  row1[1]._6_1_ = (undefined1)((ulong)uVar1 >> 0x30);
  row1[1]._7_1_ = (undefined1)((ulong)uVar1 >> 0x38);
  auVar7[1] = (undefined1)row1[1];
  auVar7[0] = (undefined1)row1[1];
  auVar7[2] = row1[1]._1_1_;
  auVar7[3] = row1[1]._1_1_;
  auVar7[4] = row1[1]._2_1_;
  auVar7[5] = row1[1]._2_1_;
  auVar7[6] = row1[1]._3_1_;
  auVar7[7] = row1[1]._3_1_;
  auVar7[8] = row1[1]._4_1_;
  auVar7[9] = row1[1]._4_1_;
  auVar7[10] = row1[1]._5_1_;
  auVar7[0xb] = row1[1]._5_1_;
  auVar7[0xc] = row1[1]._6_1_;
  auVar7[0xd] = row1[1]._6_1_;
  auVar7[0xe] = row1[1]._7_1_;
  auVar7[0xf] = row1[1]._7_1_;
  auVar7 = pshuflw(auVar7,auVar7,0);
  auVar8[1] = (undefined1)row1[1];
  auVar8[0] = (undefined1)row1[1];
  auVar8[2] = row1[1]._1_1_;
  auVar8[3] = row1[1]._1_1_;
  auVar8[4] = row1[1]._2_1_;
  auVar8[5] = row1[1]._2_1_;
  auVar8[6] = row1[1]._3_1_;
  auVar8[7] = row1[1]._3_1_;
  auVar8[8] = row1[1]._4_1_;
  auVar8[9] = row1[1]._4_1_;
  auVar8[10] = row1[1]._5_1_;
  auVar8[0xb] = row1[1]._5_1_;
  auVar8[0xc] = row1[1]._6_1_;
  auVar8[0xd] = row1[1]._6_1_;
  auVar8[0xe] = row1[1]._7_1_;
  auVar8[0xf] = row1[1]._7_1_;
  auVar8 = pshuflw(auVar8,auVar8,0x55);
  auVar9[1] = (undefined1)row1[1];
  auVar9[0] = (undefined1)row1[1];
  auVar9[2] = row1[1]._1_1_;
  auVar9[3] = row1[1]._1_1_;
  auVar9[4] = row1[1]._2_1_;
  auVar9[5] = row1[1]._2_1_;
  auVar9[6] = row1[1]._3_1_;
  auVar9[7] = row1[1]._3_1_;
  auVar9[8] = row1[1]._4_1_;
  auVar9[9] = row1[1]._4_1_;
  auVar9[10] = row1[1]._5_1_;
  auVar9[0xb] = row1[1]._5_1_;
  auVar9[0xc] = row1[1]._6_1_;
  auVar9[0xd] = row1[1]._6_1_;
  auVar9[0xe] = row1[1]._7_1_;
  auVar9[0xf] = row1[1]._7_1_;
  auVar9 = pshuflw(auVar9,auVar9,0xaa);
  auVar10[1] = (undefined1)row1[1];
  auVar10[0] = (undefined1)row1[1];
  auVar10[2] = row1[1]._1_1_;
  auVar10[3] = row1[1]._1_1_;
  auVar10[4] = row1[1]._2_1_;
  auVar10[5] = row1[1]._2_1_;
  auVar10[6] = row1[1]._3_1_;
  auVar10[7] = row1[1]._3_1_;
  auVar10[8] = row1[1]._4_1_;
  auVar10[9] = row1[1]._4_1_;
  auVar10[10] = row1[1]._5_1_;
  auVar10[0xb] = row1[1]._5_1_;
  auVar10[0xc] = row1[1]._6_1_;
  auVar10[0xd] = row1[1]._6_1_;
  auVar10[0xe] = row1[1]._7_1_;
  auVar10[0xf] = row1[1]._7_1_;
  auVar10 = pshuflw(auVar10,auVar10,0xff);
  uStack_88 = auVar7._0_4_;
  *(undefined4 *)dst = uStack_88;
  puVar6 = dst + stride;
  local_a8 = auVar8._0_4_;
  *(undefined4 *)puVar6 = local_a8;
  puVar6 = puVar6 + stride;
  local_c8 = auVar9._0_4_;
  *(undefined4 *)puVar6 = local_c8;
  puVar6 = puVar6 + stride;
  local_e8 = auVar10._0_4_;
  *(undefined4 *)puVar6 = local_e8;
  puVar6 = puVar6 + stride;
  uStack_190 = (undefined1)(undefined4)stride_local;
  uStack_18f = (undefined1)((uint)(undefined4)stride_local >> 8);
  uStack_18e = (undefined1)((uint)(undefined4)stride_local >> 0x10);
  uStack_18d = (undefined1)((uint)(undefined4)stride_local >> 0x18);
  auVar2[1] = (undefined1)row1[1];
  auVar2[0] = (undefined1)row1[1];
  auVar2[2] = row1[1]._1_1_;
  auVar2[3] = row1[1]._1_1_;
  auVar2[4] = row1[1]._2_1_;
  auVar2[5] = row1[1]._2_1_;
  auVar2[6] = row1[1]._3_1_;
  auVar2[7] = row1[1]._3_1_;
  auVar2[8] = uStack_190;
  auVar2[9] = uStack_18f;
  auVar2[10] = uStack_18e;
  auVar2[0xb] = uStack_18d;
  auVar2[0xc] = row1[1]._6_1_;
  auVar2[0xd] = row1[1]._6_1_;
  auVar2[0xe] = row1[1]._7_1_;
  auVar2[0xf] = row1[1]._7_1_;
  auVar7 = pshuflw(auVar2,auVar2,0);
  auVar3[1] = (undefined1)row1[1];
  auVar3[0] = (undefined1)row1[1];
  auVar3[2] = row1[1]._1_1_;
  auVar3[3] = row1[1]._1_1_;
  auVar3[4] = row1[1]._2_1_;
  auVar3[5] = row1[1]._2_1_;
  auVar3[6] = row1[1]._3_1_;
  auVar3[7] = row1[1]._3_1_;
  auVar3[8] = uStack_190;
  auVar3[9] = uStack_18f;
  auVar3[10] = uStack_18e;
  auVar3[0xb] = uStack_18d;
  auVar3[0xc] = row1[1]._6_1_;
  auVar3[0xd] = row1[1]._6_1_;
  auVar3[0xe] = row1[1]._7_1_;
  auVar3[0xf] = row1[1]._7_1_;
  auVar8 = pshuflw(auVar3,auVar3,0x55);
  auVar4[1] = (undefined1)row1[1];
  auVar4[0] = (undefined1)row1[1];
  auVar4[2] = row1[1]._1_1_;
  auVar4[3] = row1[1]._1_1_;
  auVar4[4] = row1[1]._2_1_;
  auVar4[5] = row1[1]._2_1_;
  auVar4[6] = row1[1]._3_1_;
  auVar4[7] = row1[1]._3_1_;
  auVar4[8] = uStack_190;
  auVar4[9] = uStack_18f;
  auVar4[10] = uStack_18e;
  auVar4[0xb] = uStack_18d;
  auVar4[0xc] = row1[1]._6_1_;
  auVar4[0xd] = row1[1]._6_1_;
  auVar4[0xe] = row1[1]._7_1_;
  auVar4[0xf] = row1[1]._7_1_;
  auVar9 = pshuflw(auVar4,auVar4,0xaa);
  auVar5[1] = (undefined1)row1[1];
  auVar5[0] = (undefined1)row1[1];
  auVar5[2] = row1[1]._1_1_;
  auVar5[3] = row1[1]._1_1_;
  auVar5[4] = row1[1]._2_1_;
  auVar5[5] = row1[1]._2_1_;
  auVar5[6] = row1[1]._3_1_;
  auVar5[7] = row1[1]._3_1_;
  auVar5[8] = uStack_190;
  auVar5[9] = uStack_18f;
  auVar5[10] = uStack_18e;
  auVar5[0xb] = uStack_18d;
  auVar5[0xc] = row1[1]._6_1_;
  auVar5[0xd] = row1[1]._6_1_;
  auVar5[0xe] = row1[1]._7_1_;
  auVar5[0xf] = row1[1]._7_1_;
  auVar10 = pshuflw(auVar5,auVar5,0xff);
  local_108 = auVar7._0_4_;
  *(undefined4 *)puVar6 = local_108;
  puVar6 = puVar6 + stride;
  local_128 = auVar8._0_4_;
  *(undefined4 *)puVar6 = local_128;
  local_148 = auVar9._0_4_;
  *(undefined4 *)(puVar6 + stride) = local_148;
  local_168 = auVar10._0_4_;
  *(undefined4 *)(puVar6 + stride + stride) = local_168;
  return;
}

Assistant:

void aom_h_predictor_4x8_sse2(uint8_t *dst, ptrdiff_t stride,
                              const uint8_t *above, const uint8_t *left) {
  (void)above;
  __m128i left_col = _mm_loadl_epi64((__m128i const *)left);
  left_col = _mm_unpacklo_epi8(left_col, left_col);
  __m128i row0 = _mm_shufflelo_epi16(left_col, 0);
  __m128i row1 = _mm_shufflelo_epi16(left_col, 0x55);
  __m128i row2 = _mm_shufflelo_epi16(left_col, 0xaa);
  __m128i row3 = _mm_shufflelo_epi16(left_col, 0xff);
  *(int *)dst = _mm_cvtsi128_si32(row0);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row1);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row2);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row3);
  dst += stride;
  left_col = _mm_unpackhi_epi64(left_col, left_col);
  row0 = _mm_shufflelo_epi16(left_col, 0);
  row1 = _mm_shufflelo_epi16(left_col, 0x55);
  row2 = _mm_shufflelo_epi16(left_col, 0xaa);
  row3 = _mm_shufflelo_epi16(left_col, 0xff);
  *(int *)dst = _mm_cvtsi128_si32(row0);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row1);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row2);
  dst += stride;
  *(int *)dst = _mm_cvtsi128_si32(row3);
}